

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

void __thiscall QJpegHandlerPrivate::~QJpegHandlerPrivate(QJpegHandlerPrivate *this)

{
  long in_RDI;
  
  if (*(long *)(in_RDI + 0x338) != 0) {
    jpeg_destroy_decompress(in_RDI + 0xa8);
    if (*(void **)(in_RDI + 0x338) != (void *)0x0) {
      operator_delete(*(void **)(in_RDI + 0x338),0x1048);
    }
    *(undefined8 *)(in_RDI + 0x338) = 0;
  }
  QByteArray::~QByteArray((QByteArray *)0x10c137);
  QList<QString>::~QList((QList<QString> *)0x10c145);
  QString::~QString((QString *)0x10c153);
  QVariant::~QVariant((QVariant *)(in_RDI + 8));
  return;
}

Assistant:

~QJpegHandlerPrivate()
    {
        if (iod_src)
        {
            jpeg_destroy_decompress(&info);
            delete iod_src;
            iod_src = nullptr;
        }
    }